

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-linked_ptr.h
# Opt level: O0

void __thiscall
testing::internal::
linked_ptr<testing::ActionInterface<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_(cv::Mat)>_>
::linked_ptr(linked_ptr<testing::ActionInterface<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_(cv::Mat)>_>
             *this,linked_ptr<testing::ActionInterface<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_(cv::Mat)>_>
                   *ptr)

{
  linked_ptr<testing::ActionInterface<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_(cv::Mat)>_>
  *ptr_local;
  linked_ptr<testing::ActionInterface<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_(cv::Mat)>_>
  *this_local;
  
  if (ptr != this) {
    linked_ptr<testing::ActionInterface<std::vector<cv::Rect_<int>,std::allocator<cv::Rect_<int>>>(cv::Mat)>>
    ::
    copy<testing::ActionInterface<std::vector<cv::Rect_<int>,std::allocator<cv::Rect_<int>>>(cv::Mat)>>
              ((linked_ptr<testing::ActionInterface<std::vector<cv::Rect_<int>,std::allocator<cv::Rect_<int>>>(cv::Mat)>>
                *)this,ptr);
    return;
  }
  __assert_fail("&ptr != this",
                "/workspace/llm4binary/github/license_all_cmakelists_25/urastogi885[P]humanDetectionModule/test/../vendor/googletest/googletest/include/gtest/internal/gtest-linked_ptr.h"
                ,0x9e,
                "testing::internal::linked_ptr<testing::ActionInterface<std::vector<cv::Rect_<int>> (cv::Mat)>>::linked_ptr(const linked_ptr<T> &) [T = testing::ActionInterface<std::vector<cv::Rect_<int>> (cv::Mat)>]"
               );
}

Assistant:

linked_ptr(linked_ptr const& ptr) {  // NOLINT
    assert(&ptr != this);
    copy(&ptr);
  }